

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOnSelf<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>
::TestBody(AssignmentOnSelf<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>
           *this)

{
  node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  *s;
  char *message;
  Generator<phmap::priv::hash_internal::EnumClass,_void> gen;
  AssertionResult gtest_ar;
  TypeParam m;
  Generator<phmap::priv::hash_internal::EnumClass,_void> local_e9;
  allocator_type local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  local_d8;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  void *local_b8;
  undefined8 uStack_b0;
  long local_a8;
  undefined4 local_a0;
  void *local_98;
  undefined8 uStack_90;
  long local_88;
  EnumClass local_80;
  EnumClass local_78;
  EnumClass local_70;
  EnumClass local_68;
  EnumClass local_60;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  local_58;
  
  local_80 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_e9);
  local_78 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_e9);
  local_70 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_e9);
  local_68 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_e9);
  local_60 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_e9);
  local_c0._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
           next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl;
  local_d8.
  super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  ._M_impl.super__Vector_impl_data._M_start =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_e8.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (pointer)((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
                       next_id<phmap::priv::StatefulTestingEqual>()::gId + 1);
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
  ::raw_hash_set<phmap::priv::hash_internal::EnumClass_const*>
            ((raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
              *)&local_58,&local_80,(EnumClass *)&local_58,0,(hasher *)&local_c0,
             (key_equal *)&local_d8,&local_e8);
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::operator=(&local_58,&local_58);
  local_a0 = 3;
  std::
  vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>
  ::vector<phmap::priv::hash_internal::EnumClass_const*,void>
            ((vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>
              *)&local_98,&local_80,(EnumClass *)&local_58,(allocator_type *)&local_d8);
  local_a8 = local_88;
  uStack_b0 = uStack_90;
  local_b8 = local_98;
  local_98 = (void *)0x0;
  uStack_90 = 0;
  local_88 = 0;
  local_c0._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_a0;
  keys<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>>
            (&local_d8,(priv *)&local_58,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::EnumClass>>
  ::operator()(&local_e8,(char *)&local_c0,
               (vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                *)"keys(m)");
  if (local_d8.
      super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8 != (void *)0x0) {
    operator_delete(local_b8,local_a8 - (long)local_b8);
  }
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  if ((char)local_e8.id_ == '\0') {
    testing::Message::Message((Message *)&local_c0);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x1dc,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_c0._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_c0._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::destroy_slots(&local_58);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOnSelf) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m(values);
  m = *&m;  // Avoid -Wself-assign.
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
}